

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void ImFontAtlasBuildRender32bppRectFromString
               (ImFontAtlas *atlas,int x,int y,int w,int h,char *in_str,char in_marker_char,
               uint in_marker_pixel_value)

{
  uint *puVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  
  if (0 < h) {
    iVar3 = atlas->TexWidth;
    puVar1 = atlas->TexPixelsRGBA32 + (long)x + (long)(y * iVar3);
    iVar2 = 0;
    do {
      if (0 < w) {
        uVar5 = 0;
        do {
          uVar4 = 0;
          if (in_str[uVar5] == in_marker_char) {
            uVar4 = in_marker_pixel_value;
          }
          puVar1[uVar5] = uVar4;
          uVar5 = uVar5 + 1;
        } while ((uint)w != uVar5);
        iVar3 = atlas->TexWidth;
      }
      iVar2 = iVar2 + 1;
      puVar1 = puVar1 + iVar3;
      in_str = in_str + w;
    } while (iVar2 != h);
  }
  return;
}

Assistant:

void ImFontAtlasBuildRender32bppRectFromString(ImFontAtlas* atlas, int x, int y, int w, int h, const char* in_str, char in_marker_char, unsigned int in_marker_pixel_value)
{
    IM_ASSERT(x >= 0 && x + w <= atlas->TexWidth);
    IM_ASSERT(y >= 0 && y + h <= atlas->TexHeight);
    unsigned int* out_pixel = atlas->TexPixelsRGBA32 + x + (y * atlas->TexWidth);
    for (int off_y = 0; off_y < h; off_y++, out_pixel += atlas->TexWidth, in_str += w)
        for (int off_x = 0; off_x < w; off_x++)
            out_pixel[off_x] = (in_str[off_x] == in_marker_char) ? in_marker_pixel_value : IM_COL32_BLACK_TRANS;
}